

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  ImGuiID *pIVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ImGuiID IVar5;
  int iVar6;
  ImGuiWindow *pIVar7;
  ImGuiShrinkWidthItem *pIVar8;
  char *__src;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ImGuiID IVar14;
  ImGuiID IVar15;
  ImGuiID IVar16;
  bool bVar17;
  bool bVar18;
  int section_n;
  long lVar19;
  ImGuiTabItem *pIVar20;
  ImGuiShrinkWidthItem *__dest;
  char *__dest_00;
  uint uVar21;
  float *pfVar22;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  ImGuiTabItem *pIVar26;
  long lVar27;
  byte bVar28;
  uint uVar29;
  ulong uVar30;
  ImGuiContext *pIVar31;
  long lVar32;
  int iVar33;
  int iVar34;
  float fVar35;
  float fVar36;
  ImVec2 IVar37;
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  float fVar41;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  float fVar46;
  ImGuiTabBarSection sections [3];
  int shrink_buffer_indexes [3];
  ImVec4 arrow_col;
  float local_fc [4];
  undefined8 local_ec;
  float local_e4;
  undefined8 local_e0;
  float local_d8;
  ImGuiContext *local_d0;
  ImVec2 local_c8;
  int local_bc [3];
  ImVec2 local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  ImVec4 local_88;
  undefined8 local_70;
  undefined1 local_68 [16];
  ImVec4 local_58;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined1 auVar39 [16];
  
  pIVar31 = GImGui;
  tab_bar->WantLayout = false;
  uVar29 = 0;
  local_fc[3] = 0.0;
  local_fc[1] = 0.0;
  local_fc[2] = 0.0;
  local_ec = 0;
  local_e4 = 0.0;
  local_e0 = 0;
  local_d8 = 0.0;
  uVar23 = (tab_bar->Tabs).Size;
  if ((int)uVar23 < 1) {
    bVar28 = 0;
  }
  else {
    lVar19 = 0;
    uVar25 = 0;
    uVar30 = 0;
    bVar28 = 0;
    do {
      pIVar26 = (tab_bar->Tabs).Data;
      pIVar1 = (ImGuiID *)((long)&pIVar26->ID + lVar19);
      if ((*(int *)((long)&pIVar26->LastFrameVisible + lVar19) < tab_bar->PrevFrameVisible) ||
         ((&pIVar26->WantClose)[lVar19] == true)) {
        IVar5 = *pIVar1;
        if (tab_bar->VisibleTabId == IVar5) {
          tab_bar->VisibleTabId = 0;
          IVar5 = *pIVar1;
        }
        if (tab_bar->SelectedTabId == IVar5) {
          tab_bar->SelectedTabId = 0;
          IVar5 = *pIVar1;
        }
        if (tab_bar->NextSelectedTabId == IVar5) {
          tab_bar->NextSelectedTabId = 0;
        }
      }
      else {
        iVar34 = (int)uVar30;
        if (uVar25 != uVar30) {
          IVar5 = pIVar1[0];
          IVar14 = pIVar1[1];
          IVar15 = pIVar1[2];
          IVar16 = pIVar1[3];
          fVar42 = (float)pIVar1[4];
          fVar35 = (float)pIVar1[5];
          fVar41 = (float)pIVar1[6];
          fVar36 = (float)pIVar1[7];
          uVar9 = *(undefined8 *)((long)pIVar1 + 0x21);
          puVar2 = (undefined8 *)((long)&pIVar26[iVar34].ContentWidth + 1);
          *puVar2 = *(undefined8 *)((long)pIVar1 + 0x19);
          puVar2[1] = uVar9;
          pfVar22 = &pIVar26[iVar34].Offset;
          *pfVar22 = fVar42;
          pfVar22[1] = fVar35;
          pfVar22[2] = fVar41;
          pfVar22[3] = fVar36;
          pIVar26 = pIVar26 + iVar34;
          pIVar26->ID = IVar5;
          pIVar26->Flags = IVar14;
          pIVar26->LastFrameVisible = IVar15;
          pIVar26->LastFrameSelected = IVar16;
          pIVar26 = (tab_bar->Tabs).Data;
        }
        pIVar26[iVar34].IndexDuringLayout = (ImS16)uVar30;
        uVar23 = pIVar26[iVar34].Flags;
        lVar32 = 0;
        if ((uVar23 & 0x40) == 0) {
          lVar32 = (ulong)((char)(byte)uVar23 < '\0') + 1;
        }
        if (0 < iVar34) {
          uVar29 = (tab_bar->Tabs).Data[uVar30 - 1].Flags;
          bVar28 = (uVar29 & 0x40) == 0 & (byte)uVar23 >> 6 | bVar28 |
                   ((uVar23 & 0xc0) != 0x80 && (uVar29 & 0xc0) == 0x80);
        }
        local_fc[lVar32 * 3 + 1] = (float)((int)local_fc[lVar32 * 3 + 1] + 1);
        uVar30 = (ulong)(iVar34 + 1);
        uVar23 = (tab_bar->Tabs).Size;
      }
      uVar29 = (uint)uVar30;
      uVar25 = uVar25 + 1;
      lVar19 = lVar19 + 0x2c;
    } while ((long)uVar25 < (long)(int)uVar23);
  }
  if (uVar23 != uVar29) {
    iVar34 = (tab_bar->Tabs).Capacity;
    if (iVar34 < (int)uVar29) {
      if (iVar34 == 0) {
        uVar23 = 8;
      }
      else {
        uVar23 = iVar34 / 2 + iVar34;
      }
      if ((int)uVar23 <= (int)uVar29) {
        uVar23 = uVar29;
      }
      pIVar20 = (ImGuiTabItem *)MemAlloc((long)(int)uVar23 * 0x2c);
      pIVar26 = (tab_bar->Tabs).Data;
      if (pIVar26 != (ImGuiTabItem *)0x0) {
        memcpy(pIVar20,pIVar26,(long)(tab_bar->Tabs).Size * 0x2c);
        MemFree((tab_bar->Tabs).Data);
      }
      (tab_bar->Tabs).Data = pIVar20;
      (tab_bar->Tabs).Capacity = uVar23;
    }
    (tab_bar->Tabs).Size = uVar29;
  }
  if ((~bVar28 & 1) == 0 && 1 < uVar29) {
    qsort((tab_bar->Tabs).Data,(long)(int)uVar29,0x2c,TabItemComparerBySection);
  }
  local_e4 = 0.0;
  local_fc[3] = 0.0;
  if (0 < (int)local_e0 + (int)local_ec && 0 < (int)local_fc[1]) {
    local_fc[3] = (pIVar31->Style).ItemInnerSpacing.x;
  }
  if (0 < (int)local_e0 && 0 < (int)local_ec) {
    local_e4 = (pIVar31->Style).ItemInnerSpacing.x;
  }
  fVar42 = (float)tab_bar->NextSelectedTabId;
  if (fVar42 != 0.0) {
    tab_bar->SelectedTabId = (ImGuiID)fVar42;
    tab_bar->NextSelectedTabId = 0;
  }
  local_d0 = pIVar31;
  if (tab_bar->ReorderRequestTabId != 0) {
    bVar17 = TabBarProcessReorder(tab_bar);
    if ((bVar17) && (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)) {
      fVar42 = (float)tab_bar->ReorderRequestTabId;
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  pIVar31 = GImGui;
  if ((tab_bar->Flags & 4) != 0) {
    pIVar7 = GImGui->CurrentWindow;
    fVar35 = (GImGui->Style).FramePadding.y;
    fVar41 = GImGui->FontSize;
    IVar37 = (pIVar7->DC).CursorPos;
    fVar36 = (tab_bar->BarRect).Min.y;
    (pIVar7->DC).CursorPos.x = (tab_bar->BarRect).Min.x - fVar35;
    (pIVar7->DC).CursorPos.y = fVar36;
    (tab_bar->BarRect).Min.x = fVar41 + fVar35 + (tab_bar->BarRect).Min.x;
    local_58.x = (pIVar31->Style).Colors[0].x;
    local_58.y = (pIVar31->Style).Colors[0].y;
    uVar10 = (pIVar31->Style).Colors[0].z;
    uVar11 = (pIVar31->Style).Colors[0].w;
    local_58.w = (float)uVar11 * 0.5;
    local_58.z = (float)uVar10;
    local_fc[0] = fVar42;
    PushStyleColor(0,&local_58);
    local_88.x = 0.0;
    local_88.y = 0.0;
    local_88.z = 0.0;
    local_88.w = 0.0;
    PushStyleColor(0x15,&local_88);
    bVar17 = BeginCombo("##v",(char *)0x0,0x50);
    PopStyleColor(2);
    if (bVar17) {
      iVar34 = (tab_bar->Tabs).Size;
      if (0 < iVar34) {
        lVar19 = 0;
        lVar32 = 0;
        pfVar22 = (float *)0x0;
        local_c8 = IVar37;
        do {
          pIVar26 = (tab_bar->Tabs).Data;
          if ((*(byte *)((long)&pIVar26->Flags + lVar19 + 2) & 0x20) == 0) {
            local_88.x = 0.0;
            local_88.y = 0.0;
            bVar17 = Selectable((tab_bar->TabsNames).Buf.Data +
                                *(int *)((long)&pIVar26->NameOffset + lVar19),
                                tab_bar->SelectedTabId == *(ImGuiID *)((long)&pIVar26->ID + lVar19),
                                0,(ImVec2 *)&local_88);
            if (bVar17) {
              pfVar22 = (float *)((long)&pIVar26->ID + lVar19);
            }
            iVar34 = (tab_bar->Tabs).Size;
          }
          lVar32 = lVar32 + 1;
          lVar19 = lVar19 + 0x2c;
        } while (lVar32 < iVar34);
        EndPopup();
        (pIVar7->DC).CursorPos = local_c8;
        fVar42 = local_fc[0];
        if (pfVar22 != (float *)0x0) {
          fVar42 = *pfVar22;
          tab_bar->SelectedTabId = (ImGuiID)fVar42;
        }
        goto LAB_00223b99;
      }
      EndPopup();
    }
    (pIVar7->DC).CursorPos = IVar37;
    fVar42 = local_fc[0];
  }
LAB_00223b99:
  local_bc[0] = 0;
  local_bc[1] = (int)local_e0 + (int)local_fc[1];
  local_bc[2] = (int)local_fc[1];
  iVar34 = (tab_bar->Tabs).Size;
  iVar33 = (local_d0->ShrinkWidthBuffer).Capacity;
  pIVar31 = local_d0;
  if (iVar33 < iVar34) {
    if (iVar33 == 0) {
      iVar33 = 8;
    }
    else {
      iVar33 = iVar33 / 2 + iVar33;
    }
    if (iVar33 <= iVar34) {
      iVar33 = iVar34;
    }
    __dest = (ImGuiShrinkWidthItem *)MemAlloc((long)iVar33 * 0xc);
    pIVar31 = local_d0;
    pIVar8 = (local_d0->ShrinkWidthBuffer).Data;
    if (pIVar8 != (ImGuiShrinkWidthItem *)0x0) {
      memcpy(__dest,pIVar8,(long)(local_d0->ShrinkWidthBuffer).Size * 0xc);
      MemFree((pIVar31->ShrinkWidthBuffer).Data);
    }
    (pIVar31->ShrinkWidthBuffer).Data = __dest;
    (pIVar31->ShrinkWidthBuffer).Capacity = iVar33;
  }
  (pIVar31->ShrinkWidthBuffer).Size = iVar34;
  bVar17 = false;
  if ((tab_bar->Tabs).Size < 1) {
    bVar18 = true;
    local_c8 = (ImVec2)0x0;
  }
  else {
    lVar19 = 0;
    lVar32 = 0;
    local_c8 = (ImVec2)0x0;
    bVar18 = false;
    iVar34 = -1;
    do {
      pIVar26 = (tab_bar->Tabs).Data;
      pfVar22 = (float *)((long)&pIVar26->ID + lVar19);
      if (((local_c8 == (ImVec2)0x0) ||
          ((int)*(float *)((long)local_c8 + 0xc) <
           *(int *)((long)&pIVar26->LastFrameSelected + lVar19))) &&
         ((*(byte *)((long)&pIVar26->Flags + lVar19 + 2) & 0x20) == 0)) {
        local_c8 = (ImVec2)pfVar22;
      }
      fVar35 = *pfVar22;
      if (fVar35 == (float)tab_bar->SelectedTabId) {
        bVar18 = true;
      }
      if ((fVar42 == 0.0) && (fVar42 = fVar35, (float)local_d0->NavJustMovedToId != fVar35)) {
        fVar42 = 0.0;
      }
      fVar35 = *(float *)((long)&pIVar26->RequestedWidth + lVar19);
      uVar23 = *(uint *)((long)&pIVar26->Flags + lVar19);
      if (fVar35 < 0.0) {
        local_fc[0] = fVar42;
        IVar37 = TabItemCalcSize((tab_bar->TabsNames).Buf.Data +
                                 *(int *)((long)&pIVar26->NameOffset + lVar19),
                                 (uVar23 & 0x100001) != 0x100000);
        fVar35 = IVar37.x;
        uVar23 = *(uint *)((long)&pIVar26->Flags + lVar19);
        fVar42 = local_fc[0];
      }
      *(float *)((long)&pIVar26->ContentWidth + lVar19) = fVar35;
      uVar25 = (ulong)(((char)uVar23 < '\0') + 1);
      if ((uVar23 & 0x40) != 0) {
        uVar25 = 0;
      }
      fVar41 = 0.0;
      if ((int)uVar25 == iVar34) {
        fVar41 = (local_d0->Style).ItemInnerSpacing.x;
      }
      local_fc[uVar25 * 3 + 2] = fVar35 + fVar41 + local_fc[uVar25 * 3 + 2];
      iVar34 = local_bc[uVar25];
      local_bc[uVar25] = iVar34 + 1;
      pIVar8 = (local_d0->ShrinkWidthBuffer).Data;
      pIVar8[iVar34].Index = (int)lVar32;
      fVar35 = *(float *)((long)&pIVar26->ContentWidth + lVar19);
      pIVar8[iVar34].InitialWidth = fVar35;
      pIVar8[iVar34].Width = fVar35;
      fVar35 = *(float *)((long)&pIVar26->ContentWidth + lVar19);
      if (fVar35 <= 1.0) {
        fVar35 = 1.0;
      }
      *(float *)((long)&pIVar26->Width + lVar19) = fVar35;
      lVar32 = lVar32 + 1;
      iVar33 = (tab_bar->Tabs).Size;
      lVar19 = lVar19 + 0x2c;
      iVar34 = (int)uVar25;
    } while (lVar32 < iVar33);
    bVar17 = 1 < iVar33;
    bVar18 = !bVar18;
  }
  fVar35 = 0.0;
  lVar19 = 8;
  do {
    fVar35 = fVar35 + *(float *)((long)local_fc + lVar19) + *(float *)((long)local_fc + lVar19 + 4);
    lVar19 = lVar19 + 0xc;
  } while (lVar19 != 0x2c);
  tab_bar->WidthAllTabsIdeal = fVar35;
  pIVar31 = GImGui;
  fVar41 = (tab_bar->BarRect).Max.x;
  local_fc[0] = (float)CONCAT31(local_fc[0]._1_3_,bVar18);
  if (((bool)(bVar17 & fVar41 - (tab_bar->BarRect).Min.x < fVar35)) &&
     ((tab_bar->Flags & 0x90U) == 0x80)) {
    pIVar7 = GImGui->CurrentWindow;
    fVar41 = GImGui->FontSize + -2.0;
    local_68 = ZEXT416((uint)fVar41);
    fVar35 = (GImGui->Style).FramePadding.y;
    local_a8 = ZEXT416((uint)(fVar35 + fVar35 + GImGui->FontSize));
    local_98 = ZEXT416((uint)(fVar41 + fVar41));
    local_b0 = (pIVar7->DC).CursorPos;
    local_58.x = (GImGui->Style).Colors[0].x;
    local_58.y = (GImGui->Style).Colors[0].y;
    uVar12 = (GImGui->Style).Colors[0].z;
    uVar13 = (GImGui->Style).Colors[0].w;
    local_58.w = (float)uVar13 * 0.5;
    local_58.z = (float)uVar12;
    PushStyleColor(0,&local_58);
    local_88.x = 0.0;
    local_88.y = 0.0;
    local_88.z = 0.0;
    local_88.w = 0.0;
    PushStyleColor(0x15,&local_88);
    local_70._0_4_ = (pIVar31->IO).KeyRepeatDelay;
    local_70._4_4_ = (pIVar31->IO).KeyRepeatRate;
    (pIVar31->IO).KeyRepeatDelay = 0.25;
    (pIVar31->IO).KeyRepeatRate = 0.2;
    fVar35 = (tab_bar->BarRect).Min.x;
    fVar41 = (tab_bar->BarRect).Max.x - (float)local_98._0_4_;
    uVar23 = -(uint)(fVar41 <= fVar35);
    local_48 = (float)(uVar23 & (uint)fVar35 | ~uVar23 & (uint)fVar41);
    uStack_44 = 0;
    uStack_40 = 0;
    uStack_3c = 0;
    fVar35 = (tab_bar->BarRect).Min.y;
    (pIVar7->DC).CursorPos.x = local_48;
    (pIVar7->DC).CursorPos.y = fVar35;
    auVar38._0_8_ = local_68._0_8_;
    auVar38._12_4_ = local_68._12_4_;
    auVar38._8_4_ = local_68._4_4_;
    auVar44._8_8_ = auVar38._8_8_;
    IVar37.x = local_68._0_4_;
    IVar37.y = (float)local_a8._0_4_;
    auVar44._0_4_ = IVar37.x;
    auVar44._4_4_ = local_a8._0_4_;
    auVar39._0_12_ = auVar44._0_12_;
    auVar39._12_4_ = local_a8._4_4_;
    local_a8 = auVar39;
    bVar17 = ArrowButtonEx("##<",0,IVar37,0x410);
    fVar35 = (tab_bar->BarRect).Min.y;
    (pIVar7->DC).CursorPos.x = local_48 + (float)local_68._0_4_;
    (pIVar7->DC).CursorPos.y = fVar35;
    bVar18 = ArrowButtonEx("##>",1,(ImVec2)local_a8._0_8_,0x410);
    iVar34 = -(uint)bVar17;
    if (bVar18) {
      iVar34 = 1;
    }
    PopStyleColor(2);
    (pIVar31->IO).KeyRepeatDelay = (float)(undefined4)local_70;
    (pIVar31->IO).KeyRepeatRate = (float)local_70._4_4_;
    if ((iVar34 != 0) && (tab_bar->SelectedTabId != 0)) {
      uVar23 = (tab_bar->Tabs).Size;
      if (0 < (int)uVar23) {
        pIVar26 = (tab_bar->Tabs).Data;
        uVar25 = 0;
        pIVar20 = pIVar26;
        do {
          if (pIVar20->ID == tab_bar->SelectedTabId) goto LAB_002240ab;
          uVar25 = uVar25 + 1;
          pIVar20 = pIVar20 + 1;
        } while (uVar23 != uVar25);
      }
    }
    (pIVar7->DC).CursorPos = local_b0;
    fVar41 = (tab_bar->BarRect).Max.x - ((float)local_98._0_4_ + 1.0);
    (tab_bar->BarRect).Max.x = fVar41;
  }
LAB_00224014:
  fVar35 = local_fc[2] + local_fc[3] + local_e0._4_4_ + local_d8;
  fVar41 = fVar41 - (tab_bar->BarRect).Min.x;
  if (fVar35 < fVar41) {
    fVar36 = (local_e4 + local_ec._4_4_) -
             ((fVar41 - (local_fc[2] + local_fc[3])) - (local_e0._4_4_ + local_d8));
    if (0.0 <= fVar36) goto LAB_00224070;
  }
  else {
    fVar36 = fVar35 - fVar41;
LAB_00224070:
    if ((1.0 <= fVar36) && ((fVar41 <= fVar35 || ((tab_bar->Flags & 0x40U) != 0)))) {
      iVar34 = (int)local_e0 + (int)local_fc[1];
      if (fVar41 <= fVar35) {
        iVar33 = 0;
      }
      else {
        iVar33 = iVar34;
        iVar34 = (int)local_ec;
      }
      lVar19 = (long)iVar33;
      ShrinkWidths((local_d0->ShrinkWidthBuffer).Data + lVar19,iVar34,fVar36);
      if (0 < iVar34) {
        lVar32 = lVar19 * 0xc + 4;
        do {
          pIVar8 = (local_d0->ShrinkWidthBuffer).Data;
          iVar24 = (int)*(float *)((long)&pIVar8->Index + lVar32);
          if (-1 < iVar24) {
            pIVar26 = (tab_bar->Tabs).Data;
            iVar6 = *(int *)((long)pIVar8 + lVar32 + -4);
            fVar35 = (float)iVar24;
            lVar27 = (ulong)((char)pIVar26[iVar6].Flags < '\0') + 1;
            if ((pIVar26[iVar6].Flags & 0x40U) != 0) {
              lVar27 = 0;
            }
            fVar41 = 1.0;
            if (1.0 <= fVar35) {
              fVar41 = fVar35;
            }
            local_fc[lVar27 * 3 + 2] = local_fc[lVar27 * 3 + 2] - (pIVar26[iVar6].Width - fVar41);
            pIVar26[iVar6].Width = fVar41;
          }
          lVar19 = lVar19 + 1;
          lVar32 = lVar32 + 0xc;
        } while (lVar19 < iVar33 + iVar34);
      }
    }
  }
  pIVar31 = local_d0;
  tab_bar->WidthAllTabs = 0.0;
  lVar19 = 0;
  fVar35 = 0.0;
  fVar41 = 0.0;
  iVar34 = 0;
  do {
    fVar36 = fVar41;
    if ((lVar19 == 2) &&
       (fVar36 = ((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x) - local_fc[8],
       fVar36 = (float)(~-(uint)(fVar36 <= 0.0) & (uint)fVar36), fVar41 <= fVar36)) {
      fVar36 = fVar41;
    }
    fVar46 = local_fc[lVar19 * 3 + 1];
    if (0 < (int)fVar46) {
      fVar46 = local_fc[lVar19 * 3 + 1];
      lVar32 = (long)iVar34 * 0x2c + 0x14;
      lVar27 = 0;
      do {
        pIVar26 = (tab_bar->Tabs).Data;
        *(float *)((long)pIVar26 + lVar32 + -4) = fVar36;
        fVar35 = 0.0;
        if (lVar27 < (long)(int)fVar46 + -1) {
          fVar35 = (local_d0->Style).ItemInnerSpacing.x;
        }
        fVar36 = fVar36 + fVar35 + *(float *)((long)&pIVar26->ID + lVar32);
        lVar27 = lVar27 + 1;
        lVar32 = lVar32 + 0x2c;
      } while (lVar27 < (int)fVar46);
      fVar35 = tab_bar->WidthAllTabs;
    }
    fVar41 = local_fc[lVar19 * 3 + 3];
    fVar45 = local_fc[lVar19 * 3 + 2] + fVar41;
    fVar35 = (float)(-(uint)(0.0 <= fVar45) & (uint)fVar45) + fVar35;
    tab_bar->WidthAllTabs = fVar35;
    fVar41 = fVar36 + fVar41;
    iVar34 = iVar34 + (int)fVar46;
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  if (local_fc[0]._0_1_ == '\0') {
    fVar41 = (float)tab_bar->SelectedTabId;
    if (fVar41 != 0.0) goto LAB_002242cf;
  }
  else {
    tab_bar->SelectedTabId = 0;
  }
  fVar41 = 0.0;
  if ((tab_bar->NextSelectedTabId == 0) && (fVar41 = 0.0, local_c8 != (ImVec2)0x0)) {
    fVar41 = *(float *)local_c8;
    tab_bar->SelectedTabId = (ImGuiID)fVar41;
    fVar42 = fVar41;
  }
LAB_002242cf:
  tab_bar->VisibleTabId = (ImGuiID)fVar41;
  tab_bar->VisibleTabWasSubmitted = false;
  if (fVar42 != 0.0) {
    iVar34 = (tab_bar->Tabs).Size;
    if (0 < (long)iVar34) {
      pfVar22 = &((tab_bar->Tabs).Data)->Width;
      lVar19 = 0;
      do {
        if ((float)((ImGuiTabItem *)(pfVar22 + -5))->ID == fVar42) {
          if (((uint)pfVar22[-4] & 0xc0) != 0) break;
          fVar42 = GImGui->FontSize;
          fVar41 = fVar42;
          if ((int)lVar19 < (int)local_fc[1]) {
            fVar41 = -0.0;
          }
          fVar41 = (pfVar22[-1] - local_fc[2]) - fVar41;
          if (iVar34 - (int)local_e0 <= (int)lVar19 + 1) {
            fVar42 = 1.0;
          }
          fVar36 = ((((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x) - local_fc[2]) -
                   local_e0._4_4_) - local_e4;
          fVar42 = (pfVar22[-1] - local_fc[2]) + *pfVar22 + fVar42;
          tab_bar->ScrollingTargetDistToVisibility = 0.0;
          if ((fVar41 < tab_bar->ScrollingTarget) || (fVar36 <= fVar42 - fVar41)) {
            fVar46 = tab_bar->ScrollingAnim - fVar42;
          }
          else {
            if (fVar42 - fVar36 <= tab_bar->ScrollingTarget) break;
            fVar46 = (fVar41 - fVar36) - tab_bar->ScrollingAnim;
            fVar41 = fVar42 - fVar36;
          }
          tab_bar->ScrollingTargetDistToVisibility = (float)(-(uint)(0.0 <= fVar46) & (uint)fVar46);
          tab_bar->ScrollingTarget = fVar41;
          break;
        }
        lVar19 = lVar19 + 1;
        pfVar22 = pfVar22 + 0xb;
      } while (iVar34 != lVar19);
    }
  }
  fVar42 = (tab_bar->BarRect).Min.x;
  fVar41 = (tab_bar->BarRect).Max.x;
  auVar40._0_4_ = fVar35 - (fVar41 - fVar42);
  uVar3 = tab_bar->ScrollingAnim;
  uVar4 = tab_bar->ScrollingTarget;
  auVar43._4_4_ = uVar4;
  auVar43._0_4_ = uVar3;
  auVar43._8_8_ = 0;
  auVar40._4_4_ = auVar40._0_4_;
  auVar40._8_4_ = auVar40._0_4_;
  auVar40._12_4_ = auVar40._0_4_;
  auVar44 = minps(auVar43,auVar40);
  fVar35 = (float)(-(uint)(0.0 <= auVar44._0_4_) & (uint)auVar44._0_4_);
  fVar36 = (float)(-(uint)(0.0 <= auVar44._4_4_) & (uint)auVar44._4_4_);
  tab_bar->ScrollingAnim = fVar35;
  tab_bar->ScrollingTarget = fVar36;
  if ((fVar35 != fVar36) || (NAN(fVar35) || NAN(fVar36))) {
    fVar46 = local_d0->FontSize * 70.0;
    uVar23 = -(uint)(fVar46 <= tab_bar->ScrollingSpeed);
    fVar45 = ABS(fVar36 - fVar35) / 0.3;
    fVar46 = (float)(~uVar23 & (uint)fVar46 | (uint)tab_bar->ScrollingSpeed & uVar23);
    uVar23 = -(uint)(fVar45 <= fVar46);
    fVar45 = (float)(~uVar23 & (uint)fVar45 | uVar23 & (uint)fVar46);
    tab_bar->ScrollingSpeed = fVar45;
    fVar46 = fVar36;
    if ((local_d0->FrameCount <= tab_bar->PrevFrameVisible + 1) &&
       (tab_bar->ScrollingTargetDistToVisibility <= local_d0->FontSize * 10.0)) {
      fVar45 = fVar45 * (local_d0->IO).DeltaTime;
      if (fVar36 <= fVar35) {
        fVar46 = fVar35;
        if (fVar36 < fVar35) {
          fVar35 = fVar35 - fVar45;
          uVar23 = -(uint)(fVar36 <= fVar35);
          fVar46 = (float)((uint)fVar35 & uVar23 | ~uVar23 & (uint)fVar36);
        }
      }
      else {
        fVar46 = fVar35 + fVar45;
        if (fVar36 <= fVar46) {
          fVar46 = fVar36;
        }
      }
    }
    tab_bar->ScrollingAnim = fVar46;
  }
  else {
    tab_bar->ScrollingSpeed = 0.0;
  }
  tab_bar->ScrollingRectMinX = fVar42 + local_fc[2] + local_fc[3];
  tab_bar->ScrollingRectMaxX = (fVar41 - local_e0._4_4_) - local_e4;
  if ((tab_bar->Flags & 0x100000) == 0) {
    if ((tab_bar->TabsNames).Buf.Capacity < 0) {
      __dest_00 = (char *)MemAlloc(0);
      __src = (tab_bar->TabsNames).Buf.Data;
      if (__src != (char *)0x0) {
        memcpy(__dest_00,__src,(long)(tab_bar->TabsNames).Buf.Size);
        MemFree((tab_bar->TabsNames).Buf.Data);
      }
      (tab_bar->TabsNames).Buf.Data = __dest_00;
      (tab_bar->TabsNames).Buf.Capacity = 0;
    }
    (tab_bar->TabsNames).Buf.Size = 0;
  }
  pIVar7 = pIVar31->CurrentWindow;
  (pIVar7->DC).CursorPos = (tab_bar->BarRect).Min;
  local_58.y = (tab_bar->BarRect).Max.y - (tab_bar->BarRect).Min.y;
  local_58.x = tab_bar->WidthAllTabs;
  ItemSize((ImVec2 *)&local_58,(tab_bar->FramePadding).y);
  fVar35 = (tab_bar->BarRect).Min.x + tab_bar->WidthAllTabsIdeal;
  fVar42 = (pIVar7->DC).IdealMaxPos.x;
  uVar23 = -(uint)(fVar35 <= fVar42);
  (pIVar7->DC).IdealMaxPos.x = (float)(uVar23 & (uint)fVar42 | ~uVar23 & (uint)fVar35);
  return;
LAB_002240ab:
  do {
    uVar29 = (uint)uVar25;
    uVar21 = iVar34 + uVar29;
    uVar25 = (ulong)uVar21;
    if (uVar21 < uVar23) {
      uVar29 = uVar21;
    }
  } while (((pIVar26[(int)uVar29].Flags & 0x200000) != 0) && (iVar34 + uVar21 < uVar23));
  (pIVar7->DC).CursorPos = local_b0;
  fVar41 = (tab_bar->BarRect).Max.x - ((float)local_98._0_4_ + 1.0);
  (tab_bar->BarRect).Max.x = fVar41;
  fVar42 = (float)pIVar26[(int)uVar29].ID;
  if ((pIVar26[(int)uVar29].Flags & 0x200000) == 0) {
    tab_bar->SelectedTabId = (ImGuiID)fVar42;
  }
  goto LAB_00224014;
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect by compacting list
    // Detect if we need to sort out tab list (e.g. in rare case where a tab changed section)
    int tab_dst_n = 0;
    bool need_sort_by_section = false;
    ImGuiTabBarSection sections[3]; // Layout sections: Leading, Central, Trailing
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible || tab->WantClose)
        {
            // Remove tab
            if (tab_bar->VisibleTabId == tab->ID) { tab_bar->VisibleTabId = 0; }
            if (tab_bar->SelectedTabId == tab->ID) { tab_bar->SelectedTabId = 0; }
            if (tab_bar->NextSelectedTabId == tab->ID) { tab_bar->NextSelectedTabId = 0; }
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];

        tab = &tab_bar->Tabs[tab_dst_n];
        tab->IndexDuringLayout = (ImS16)tab_dst_n;

        // We will need sorting if tabs have changed section (e.g. moved from one of Leading/Central/Trailing to another)
        int curr_tab_section_n = TabItemGetSectionIdx(tab);
        if (tab_dst_n > 0)
        {
            ImGuiTabItem* prev_tab = &tab_bar->Tabs[tab_dst_n - 1];
            int prev_tab_section_n = TabItemGetSectionIdx(prev_tab);
            if (curr_tab_section_n == 0 && prev_tab_section_n != 0)
                need_sort_by_section = true;
            if (prev_tab_section_n == 2 && curr_tab_section_n != 2)
                need_sort_by_section = true;
        }

        sections[curr_tab_section_n].TabCount++;
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    if (need_sort_by_section)
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerBySection);

    // Calculate spacing between sections
    sections[0].Spacing = sections[0].TabCount > 0 && (sections[1].TabCount + sections[2].TabCount) > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;
    sections[1].Spacing = sections[1].TabCount > 0 && sections[2].TabCount > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;

    // Setup next selected tab
    ImGuiID scroll_to_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_to_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (TabBarProcessReorder(tab_bar))
            if (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)
                scroll_to_tab_id = tab_bar->ReorderRequestTabId;
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Min.x!
            scroll_to_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // Leading/Trailing tabs will be shrink only if central one aren't visible anymore, so layout the shrink data as: leading, trailing, central
    // (whereas our tabs are stored as: leading, central, trailing)
    int shrink_buffer_indexes[3] = { 0, sections[0].TabCount + sections[2].TabCount, sections[0].TabCount };
    g.ShrinkWidthBuffer.resize(tab_bar->Tabs.Size);

    // Compute ideal tabs widths + store them into shrink buffer
    ImGuiTabItem* most_recently_selected_tab = NULL;
    int curr_section_n = -1;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if ((most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected) && !(tab->Flags & ImGuiTabItemFlags_Button))
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;
        if (scroll_to_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_to_tab_id = tab->ID;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        const bool has_close_button_or_unsaved_marker = (tab->Flags & ImGuiTabItemFlags_NoCloseButton) == 0 || (tab->Flags & ImGuiTabItemFlags_UnsavedDocument);
        tab->ContentWidth = (tab->RequestedWidth >= 0.0f) ? tab->RequestedWidth : TabItemCalcSize(tab_name, has_close_button_or_unsaved_marker).x;

        int section_n = TabItemGetSectionIdx(tab);
        ImGuiTabBarSection* section = &sections[section_n];
        section->Width += tab->ContentWidth + (section_n == curr_section_n ? g.Style.ItemInnerSpacing.x : 0.0f);
        curr_section_n = section_n;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        IM_MSVC_WARNING_SUPPRESS(6385);
        ImGuiShrinkWidthItem* shrink_width_item = &g.ShrinkWidthBuffer[shrink_buffer_indexes[section_n]++];
        shrink_width_item->Index = tab_n;
        shrink_width_item->Width = shrink_width_item->InitialWidth = tab->ContentWidth;
        tab->Width = ImMax(tab->ContentWidth, 1.0f);
    }

    // Compute total ideal width (used for e.g. auto-resizing a window)
    tab_bar->WidthAllTabsIdeal = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
        tab_bar->WidthAllTabsIdeal += sections[section_n].Width + sections[section_n].Spacing;

    // Horizontal scrolling buttons
    // (note that TabBarScrollButtons() will alter BarRect.Max.x)
    if ((tab_bar->WidthAllTabsIdeal > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll))
        if (ImGuiTabItem* scroll_and_select_tab = TabBarScrollingButtons(tab_bar))
        {
            scroll_to_tab_id = scroll_and_select_tab->ID;
            if ((scroll_and_select_tab->Flags & ImGuiTabItemFlags_Button) == 0)
                tab_bar->SelectedTabId = scroll_to_tab_id;
        }

    // Shrink widths if full tabs don't fit in their allocated space
    float section_0_w = sections[0].Width + sections[0].Spacing;
    float section_1_w = sections[1].Width + sections[1].Spacing;
    float section_2_w = sections[2].Width + sections[2].Spacing;
    bool central_section_is_visible = (section_0_w + section_2_w) < tab_bar->BarRect.GetWidth();
    float width_excess;
    if (central_section_is_visible)
        width_excess = ImMax(section_1_w - (tab_bar->BarRect.GetWidth() - section_0_w - section_2_w), 0.0f); // Excess used to shrink central section
    else
        width_excess = (section_0_w + section_2_w) - tab_bar->BarRect.GetWidth(); // Excess used to shrink leading/trailing section

    // With ImGuiTabBarFlags_FittingPolicyScroll policy, we will only shrink leading/trailing if the central section is not visible anymore
    if (width_excess >= 1.0f && ((tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown) || !central_section_is_visible))
    {
        int shrink_data_count = (central_section_is_visible ? sections[1].TabCount : sections[0].TabCount + sections[2].TabCount);
        int shrink_data_offset = (central_section_is_visible ? sections[0].TabCount + sections[2].TabCount : 0);
        ShrinkWidths(g.ShrinkWidthBuffer.Data + shrink_data_offset, shrink_data_count, width_excess);

        // Apply shrunk values into tabs and sections
        for (int tab_n = shrink_data_offset; tab_n < shrink_data_offset + shrink_data_count; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[g.ShrinkWidthBuffer[tab_n].Index];
            float shrinked_width = IM_FLOOR(g.ShrinkWidthBuffer[tab_n].Width);
            if (shrinked_width < 0.0f)
                continue;

            shrinked_width = ImMax(1.0f, shrinked_width);
            int section_n = TabItemGetSectionIdx(tab);
            sections[section_n].Width -= (tab->Width - shrinked_width);
            tab->Width = shrinked_width;
        }
    }

    // Layout all active tabs
    int section_tab_index = 0;
    float tab_offset = 0.0f;
    tab_bar->WidthAllTabs = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
    {
        ImGuiTabBarSection* section = &sections[section_n];
        if (section_n == 2)
            tab_offset = ImMin(ImMax(0.0f, tab_bar->BarRect.GetWidth() - section->Width), tab_offset);

        for (int tab_n = 0; tab_n < section->TabCount; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[section_tab_index + tab_n];
            tab->Offset = tab_offset;
            tab_offset += tab->Width + (tab_n < section->TabCount - 1 ? g.Style.ItemInnerSpacing.x : 0.0f);
        }
        tab_bar->WidthAllTabs += ImMax(section->Width + section->Spacing, 0.0f);
        tab_offset += section->Spacing;
        section_tab_index += section->TabCount;
    }

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_to_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // Update scrolling
    if (scroll_to_tab_id != 0)
        TabBarScrollToTab(tab_bar, scroll_to_tab_id, sections);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }
    tab_bar->ScrollingRectMinX = tab_bar->BarRect.Min.x + sections[0].Width + sections[0].Spacing;
    tab_bar->ScrollingRectMaxX = tab_bar->BarRect.Max.x - sections[2].Width - sections[1].Spacing;

    // Clear name buffers
    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        tab_bar->TabsNames.Buf.resize(0);

    // Actual layout in host window (we don't do it in BeginTabBar() so as not to waste an extra frame)
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.CursorPos = tab_bar->BarRect.Min;
    ItemSize(ImVec2(tab_bar->WidthAllTabs, tab_bar->BarRect.GetHeight()), tab_bar->FramePadding.y);
    window->DC.IdealMaxPos.x = ImMax(window->DC.IdealMaxPos.x, tab_bar->BarRect.Min.x + tab_bar->WidthAllTabsIdeal);
}